

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

size_t bakeBMQVStep4_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  long lVar1;
  size_t n_00;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t in_RSI;
  size_t in_RDI;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  
  lVar1 = in_RDI * 6;
  sVar9 = in_RSI;
  n_00 = ecpIsOnA_deep(in_RDI,in_RSI);
  sVar2 = ecMulA_deep(n_00,sVar9,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sVar3 = beltHash_keep();
  sVar4 = zzMul_deep(in_RDI >> 1,in_RDI);
  sVar5 = zzMod_deep(in_RDI + (in_RDI >> 1) + 1,in_RDI);
  sVar6 = ecpSubAA_deep(in_RDI,in_RSI);
  sVar7 = beltKRP_keep();
  sVar8 = beltMAC_keep();
  sVar9 = utilMax(9,sVar9,n_00,sVar2,sVar3,sVar4,sVar5,sVar6,sVar7,sVar8);
  return (lVar1 + 2) * 8 + sVar9;
}

Assistant:

static size_t bakeBMQVStep4_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return O_OF_W(6 * n + 2) +
		utilMax(9,
			f_deep,
			ecpIsOnA_deep(n, f_deep),
			ecMulA_deep(n, ec_d, ec_deep, n),
			beltHash_keep(),
			zzMul_deep(n / 2, n),
			zzMod_deep(n + n / 2 + 1, n),
			ecpSubAA_deep(n, f_deep),
			beltKRP_keep(),
			beltMAC_keep());
}